

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initest.c
# Opt level: O0

void hralg(double *x,int N,int p,int q,double *phi,double *theta,double *var)

{
  int iVar1;
  int cols;
  double *x_00;
  double *phi_00;
  void *__ptr;
  double *sig;
  double *col;
  double *C;
  double *C_00;
  double *x_01;
  int *ipiv_00;
  double dVar2;
  int *ipiv;
  double *temp;
  double *b;
  double *A;
  double *zt;
  double *z;
  double *a;
  double *phim;
  double *inp;
  double sos;
  double wmean;
  int k;
  int j;
  int pq;
  int t;
  int i;
  int m;
  double *theta_local;
  double *phi_local;
  int q_local;
  int p_local;
  int N_local;
  double *x_local;
  
  x_00 = (double *)malloc((long)N << 3);
  t = q;
  if (q < p) {
    t = p;
  }
  if ((t < 10) && (p + q + 0x14 < N)) {
    t = 10;
  }
  else {
    t = t + 1;
  }
  cols = p + q;
  phi_00 = (double *)malloc((long)t << 3);
  __ptr = malloc((long)N << 3);
  sig = (double *)malloc((long)((N - t) - q) * 8 * (long)cols);
  col = (double *)malloc((long)((N - t) - q) * 8 * (long)cols);
  C = (double *)malloc((long)cols * 8 * (long)cols);
  C_00 = (double *)malloc((long)cols << 3);
  x_01 = (double *)malloc((long)cols << 3);
  ipiv_00 = (int *)malloc((long)cols << 2);
  dVar2 = mean(x,N);
  for (pq = 0; pq < N; pq = pq + 1) {
    x_00[pq] = x[pq] - dVar2;
  }
  ywalg(x_00,N,t,phi_00);
  for (pq = 0; pq < N; pq = pq + 1) {
    *(undefined8 *)((long)__ptr + (long)pq * 8) = 0;
  }
  for (j = t; j < N; j = j + 1) {
    *(double *)((long)__ptr + (long)j * 8) = x_00[j];
    for (pq = 0; pq < t; pq = pq + 1) {
      *(double *)((long)__ptr + (long)j * 8) =
           -phi_00[pq] * x_00[(j - pq) + -1] + *(double *)((long)__ptr + (long)j * 8);
    }
  }
  for (pq = 0; pq < (N - t) - q; pq = pq + 1) {
    for (wmean._4_4_ = 0; wmean._4_4_ < p; wmean._4_4_ = wmean._4_4_ + 1) {
      sig[pq * cols + wmean._4_4_] = x_00[((t + q + pq) - wmean._4_4_) + -1];
    }
    for (wmean._0_4_ = 0; wmean._0_4_ < q; wmean._0_4_ = wmean._0_4_ + 1) {
      sig[pq * cols + p + wmean._0_4_] =
           -*(double *)((long)__ptr + (long)(((t + q + pq) - wmean._0_4_) + -1) * 8);
    }
  }
  mtranspose(sig,(N - t) - q,cols,col);
  mmult(col,sig,C,cols,(N - t) - q,cols);
  mmult(col,x_00 + (long)t + (long)q,C_00,cols,(N - t) - q,1);
  ludecomp(C,cols,ipiv_00);
  linsolve(C,cols,C_00,ipiv_00,x_01);
  for (pq = 0; iVar1 = p, pq < p; pq = pq + 1) {
    phi[pq] = x_01[pq];
  }
  while (pq = iVar1, pq < cols) {
    theta[pq - p] = x_01[pq];
    iVar1 = pq + 1;
  }
  inp = (double *)0x0;
  for (j = t + q; j < N; j = j + 1) {
    sos = x_00[j];
    for (pq = 0; pq < p; pq = pq + 1) {
      sos = -phi[pq] * x_00[(j - pq) + -1] + sos;
    }
    for (pq = 0; pq < q; pq = pq + 1) {
      sos = theta[pq] * *(double *)((long)__ptr + (long)((j - pq) + -1) * 8) + sos;
    }
    inp = (double *)(sos * sos + (double)inp);
  }
  *var = (double)inp / (double)((N - t) - q);
  free(x_00);
  free(phi_00);
  free(__ptr);
  free(sig);
  free(col);
  free(C);
  free(C_00);
  free(ipiv_00);
  free(x_01);
  return;
}

Assistant:

void hralg(double *x, int N, int p,int q, double *phi,double *theta, double *var) {
	int m,i,t,pq,j,k;
	double wmean,sos;
	double *inp,*phim,*a,*z,*zt,*A,*b,*temp;
	int *ipiv;

	inp = (double*)malloc(sizeof(double)* N);

	if (p > q) {
		m = p;
	}
	else {
		m = q;
	}

	if (m < 10  && N > p+q+20) {
		m = 10;
	}
	else {
		m = m + 1;
	}

	pq = p + q;

	phim = (double*)malloc(sizeof(double)* m);
	a = (double*)malloc(sizeof(double)* N);
	z = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	zt = (double*)malloc(sizeof(double)* (N - m - q) * pq);
	A = (double*)malloc(sizeof(double)* pq * pq);
	b = (double*)malloc(sizeof(double)* pq);
	temp = (double*)malloc(sizeof(double)* pq);
	ipiv = (int*)malloc(sizeof(int)* pq);

	wmean = mean(x, N);

	for (i = 0; i < N; ++i) {
		inp[i] = x[i] - wmean;
	}

	// Estimate AR(m) coefficients

	ywalg(inp, N, m, phim);

	for (i = 0; i < N; ++i) {
		a[i] = 0.0;
	}

	for (t = m; t < N; ++t) {
		a[t] = inp[t];
		for (i = 0; i < m; ++i) {
			a[t] -= phim[i] * inp[t - i - 1];
		}
	}

	for (i = 0; i < N - m - q; ++i) {
		t = i * pq;
		for (j = 0; j < p; ++j) {
			z[t + j] = inp[m + q + i - j - 1];
		}

		for (k = 0; k < q; ++k) {
			z[t + p + k] = -a[m + q + i - k - 1];
		}
	}

	mtranspose(z, N - m - q, pq, zt);
	mmult(zt, z, A, pq, N - m - q, pq);
	mmult(zt, inp + m + q, b, pq, N - m - q, 1);


	ludecomp(A, pq, ipiv);
	linsolve(A, pq, b, ipiv, temp);

	for (i = 0; i < p; ++i) {
		phi[i] = temp[i];
	}

	for (i = p; i < pq; ++i) {
		theta[i-p] = temp[i];
	}
	sos = 0.0;
	for (t = m+q; t < N; ++t) {
		wmean = inp[t];
		for (i = 0; i < p; ++i) {
			wmean -= (phi[i] * inp[t - i - 1]);
		}

		for (i = 0; i < q; ++i) {
			wmean += (theta[i] * a[t - i - 1]);
		}

		sos += (wmean*wmean);
	}

	*var = sos / (N - m - q);

	free(inp);
	free(phim);
	free(a);
	free(z);
	free(zt);
	free(A);
	free(b);
	free(ipiv);
	free(temp);
}